

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_subpel_search_method
               (MotionVectorSearchParams *mv_search_params,uint motion_vector_unit_test,
               SUBPEL_SEARCH_METHOD subpel_search_method)

{
  SUBPEL_SEARCH_METHOD subpel_search_method_local;
  uint motion_vector_unit_test_local;
  MotionVectorSearchParams *mv_search_params_local;
  
  mv_search_params->find_fractional_mv_step = fractional_mv_search[subpel_search_method];
  if (motion_vector_unit_test == 1) {
    mv_search_params->find_fractional_mv_step = av1_return_max_sub_pixel_mv;
  }
  else if (motion_vector_unit_test == 2) {
    mv_search_params->find_fractional_mv_step = av1_return_min_sub_pixel_mv;
  }
  return;
}

Assistant:

static void set_subpel_search_method(
    MotionVectorSearchParams *mv_search_params,
    unsigned int motion_vector_unit_test,
    SUBPEL_SEARCH_METHOD subpel_search_method) {
  assert(subpel_search_method <= SUBPEL_TREE_PRUNED_MORE);
  mv_search_params->find_fractional_mv_step =
      fractional_mv_search[subpel_search_method];

  // This is only used in motion vector unit test.
  if (motion_vector_unit_test == 1)
    mv_search_params->find_fractional_mv_step = av1_return_max_sub_pixel_mv;
  else if (motion_vector_unit_test == 2)
    mv_search_params->find_fractional_mv_step = av1_return_min_sub_pixel_mv;
}